

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O2

Token * __thiscall llbuild::ninja::Lexer::lexIdentifier(Lexer *this,Token *result)

{
  char c;
  bool bVar1;
  
  while( true ) {
    if (this->bufferPos == (this->buffer).Data + (this->buffer).Length) {
      c = -1;
    }
    else {
      c = *this->bufferPos;
    }
    bVar1 = isIdentifierChar(c);
    if (!bVar1) break;
    getNextChar(this);
  }
  if (this->mode == IdentifierSpecific) {
    result->tokenKind = Identifier;
    result->length = *(int *)&this->bufferPos - *(int *)&result->start;
  }
  else {
    setIdentifierTokenKind(this,result);
  }
  return result;
}

Assistant:

Token& Lexer::lexIdentifier(Token& result) {
  // Consume characters as long as we are in an identifier.
  while (Lexer::isIdentifierChar(peekNextChar())) {
    getNextChar();
  }

  // If we are in identifier specific mode, ignore keywords.
  if (mode == Lexer::LexingMode::IdentifierSpecific)
    return setTokenKind(result, Token::Kind::Identifier);

  // Recognize keywords specially.
  return setIdentifierTokenKind(result);
}